

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

Id dxil_spv::emit_fp8_to_fp16_coopmat(Impl *impl,Id v,CooperativeMatrixUse use)

{
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Operation *pOVar5;
  Id aux_types [2];
  Id local_38;
  Id local_34;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,0x10,false);
  IVar2 = spv::Builder::makeIntegerType(this,8,false);
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = spv::Builder::makeIntConstant(this,IVar3,use,false);
  IVar2 = spv::Builder::makeCooperativeMatrixType(this,IVar2,IVar1,IVar1,IVar3);
  IVar3 = spv::Builder::makeFloatType(this,0x10);
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar4 = spv::Builder::makeIntConstant(this,IVar4,use,false);
  IVar1 = spv::Builder::makeCooperativeMatrixType(this,IVar3,IVar1,IVar1,IVar4);
  local_38 = IVar2;
  local_34 = IVar1;
  IVar3 = SPIRVModule::get_helper_call_id(impl->spirv_module,CoopMatFP8toFP16,&local_38,2);
  IVar2 = Converter::Impl::create_variable(impl,StorageClassFunction,IVar2,(char *)0x0);
  pOVar5 = Converter::Impl::allocate(impl,OpStore);
  Operation::add_id(pOVar5,IVar2);
  Operation::add_id(pOVar5,v);
  Converter::Impl::add(impl,pOVar5,false);
  pOVar5 = Converter::Impl::allocate(impl,OpFunctionCall,IVar1);
  Operation::add_id(pOVar5,IVar3);
  Operation::add_id(pOVar5,IVar2);
  Converter::Impl::add(impl,pOVar5,false);
  return pOVar5->id;
}

Assistant:

static spv::Id emit_fp8_to_fp16_coopmat(Converter::Impl &impl, spv::Id v, spv::CooperativeMatrixUse use)
{
	auto &builder = impl.builder();
	spv::Id rows_cols = builder.makeUintConstant(16);
	spv::Id u8_type = builder.makeCooperativeMatrixType(
		builder.makeUintType(8), rows_cols, rows_cols, builder.makeUintConstant(use));
	spv::Id f16_type = builder.makeCooperativeMatrixType(
		builder.makeFloatType(16), rows_cols, rows_cols, builder.makeUintConstant(use));

	spv::Id aux_types[2] = { u8_type, f16_type };
	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::CoopMatFP8toFP16, aux_types, 2);

	// RADV workaround. Should pass as value, but NIR aborts.
	spv::Id param = impl.create_variable(spv::StorageClassFunction, u8_type);
	auto *store = impl.allocate(spv::OpStore);
	store->add_id(param);
	store->add_id(v);
	impl.add(store);

	auto *call = impl.allocate(spv::OpFunctionCall, f16_type);
	call->add_id(call_id);
	call->add_id(param);
	impl.add(call);

	return call->id;
}